

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O0

bool caffe::UpgradeSolverAsNeeded(string *param_file,SolverParameter *param)

{
  bool bVar1;
  bool local_19;
  bool success;
  SolverParameter *param_local;
  string *param_file_local;
  
  local_19 = true;
  bVar1 = SolverNeedsTypeUpgrade(param);
  if (bVar1) {
    local_19 = UpgradeSolverType(param);
  }
  return local_19;
}

Assistant:

bool UpgradeSolverAsNeeded(const string& param_file, SolverParameter* param) {
  bool success = true;
  // Try to upgrade old style solver_type enum fields into new string type
  if (SolverNeedsTypeUpgrade(*param)) {
    /*
     Attempting to upgrade input file specified using deprecated 'solver_type' field (enum).
     */
    if (!UpgradeSolverType(param)) {
      success = false;
      /*
       Warning: had one or more problems upgrading SolverType (see above).
       */
    } else {
      /*
       Successfully upgraded file specified using deprecated 'solver_type' field (enum) to 'type' field (string).
       Note that future Caffe releases will only support 'type' field (string) for a solver's type.
       */
    }
  }
  return success;
}